

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

lyxml_attr * parse_attr(ly_ctx *ctx,char *data,uint *len,lyxml_elem *parent)

{
  char delim_00;
  int iVar1;
  lyxml_ns *plVar2;
  char *pcVar3;
  bool bVar4;
  bool local_7e;
  uint local_7c;
  long lStack_78;
  uint size;
  lyxml_attr *a;
  lyxml_attr *attr;
  char *pcStack_60;
  int uc;
  char *str;
  char *pcStack_50;
  char xml_flag;
  char *prefix;
  char *delim;
  char *start;
  char *c;
  lyxml_elem *parent_local;
  uint *len_local;
  char *data_local;
  ly_ctx *ctx_local;
  
  pcStack_50 = (char *)0x0;
  a = (lyxml_attr *)0x0;
  start = data;
  c = &parent->flags;
  parent_local = (lyxml_elem *)len;
  len_local = (uint *)data;
  data_local = (char *)ctx;
  iVar1 = strncmp(data,"xmlns",5);
  if (iVar1 == 0) {
    a = (lyxml_attr *)calloc(1,0x28);
    if (a == (lyxml_attr *)0x0) {
      ly_log((ly_ctx *)data_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_attr");
      return (lyxml_attr *)0x0;
    }
    a->type = LYXML_ATTR_NS;
    a->ns = (lyxml_ns *)c;
    pcVar3 = start + 5;
    if (start[5] != ':') goto LAB_0012fca3;
    start = start + 6;
  }
  else {
    a = (lyxml_attr *)calloc(1,0x28);
    if (a == (lyxml_attr *)0x0) {
      ly_log((ly_ctx *)data_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_attr");
      return (lyxml_attr *)0x0;
    }
    a->type = LYXML_ATTR_STD;
  }
  delim = start;
  attr._4_4_ = lyxml_getutf8((ly_ctx *)data_local,start,&local_7c);
  if (((((((((attr._4_4_ < 0x61) || (0x7a < attr._4_4_)) && (attr._4_4_ != 0x5f)) &&
          ((attr._4_4_ < 0x41 || (0x5a < attr._4_4_)))) && (attr._4_4_ != 0x3a)) &&
        (((attr._4_4_ < 0x370 || (0x1fff < attr._4_4_)) || (attr._4_4_ == 0x37e)))) &&
       ((((attr._4_4_ < 0xc0 || (0x2ff < attr._4_4_)) || (attr._4_4_ == 0xd7)) ||
        (attr._4_4_ == 0xf7)))) &&
      ((((attr._4_4_ != 0x200c && (attr._4_4_ != 0x200d)) &&
        ((attr._4_4_ < 0x2070 || (0x218f < attr._4_4_)))) &&
       ((attr._4_4_ < 0x2c00 || (0x2fef < attr._4_4_)))))) &&
     (((attr._4_4_ < 0x3001 || (0xd7ff < attr._4_4_)) &&
      ((((attr._4_4_ < 0xf900 || (0xfdcf < attr._4_4_)) &&
        ((attr._4_4_ < 0xfdf0 || (0xfffd < attr._4_4_)))) &&
       ((attr._4_4_ < 0x10000 || (0xeffff < attr._4_4_)))))))) {
    ly_vlog((ly_ctx *)data_local,LYE_XML_INVAL,LY_VLOG_NONE,(void *)0x0,
            "NameStartChar of the attribute");
    free(a);
    return (lyxml_attr *)0x0;
  }
  str._7_1_ = '\x04';
  if (*start == 'x') {
    str._7_1_ = '\x01';
  }
  start = start + local_7c;
  attr._4_4_ = lyxml_getutf8((ly_ctx *)data_local,start,&local_7c);
  while( true ) {
    if (((((((attr._4_4_ < 0x61) || (local_7e = true, 0x7a < attr._4_4_)) &&
           (local_7e = true, attr._4_4_ != 0x5f)) &&
          ((local_7e = true, attr._4_4_ != 0x2d &&
           ((attr._4_4_ < 0x41 || (local_7e = true, 0x5a < attr._4_4_)))))) &&
         ((attr._4_4_ < 0x30 || (local_7e = true, 0x39 < attr._4_4_)))) &&
        (((local_7e = true, attr._4_4_ != 0x3a && (local_7e = true, attr._4_4_ != 0x2e)) &&
         ((local_7e = true, attr._4_4_ != 0xb7 &&
          (((attr._4_4_ < 0x370 || (0x1fff < attr._4_4_)) || (local_7e = true, attr._4_4_ == 0x37e))
          )))))) &&
       (((((attr._4_4_ < 0xc0 || (0x2ff < attr._4_4_)) || (attr._4_4_ == 0xd7)) ||
         (local_7e = true, attr._4_4_ == 0xf7)) &&
        ((((((local_7e = true, attr._4_4_ != 0x200c && (local_7e = true, attr._4_4_ != 0x200d)) &&
            ((attr._4_4_ < 0x300 || (local_7e = true, 0x36f < attr._4_4_)))) &&
           ((attr._4_4_ < 0x2070 || (local_7e = true, 0x218f < attr._4_4_)))) &&
          ((attr._4_4_ < 0x2030f || (local_7e = true, 0x2040 < attr._4_4_)))) &&
         ((((attr._4_4_ < 0x2c00 || (local_7e = true, 0x2fef < attr._4_4_)) &&
           ((attr._4_4_ < 0x3001 || (local_7e = true, 0xd7ff < attr._4_4_)))) &&
          (((attr._4_4_ < 0xf900 || (local_7e = true, 0xfdcf < attr._4_4_)) &&
           ((attr._4_4_ < 0xfdf0 || (local_7e = true, 0xfffd < attr._4_4_)))))))))))) {
      local_7e = 0xffff < attr._4_4_ && attr._4_4_ < 0xf0000;
    }
    if (!local_7e) break;
    if (a->type == LYXML_ATTR_STD) {
      if ((*start == ':') && (str._7_1_ != '\x03')) {
        delim = start + 1;
        pcStack_50 = (char *)malloc((size_t)(start + (1 - (long)len_local)));
        if (pcStack_50 == (char *)0x0) {
          ly_log((ly_ctx *)data_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "parse_attr");
          goto LAB_0012fea6;
        }
        memcpy(pcStack_50,len_local,(long)start - (long)len_local);
        pcStack_50[(long)start - (long)len_local] = '\0';
        plVar2 = lyxml_get_ns((lyxml_elem *)c,pcStack_50);
        a->ns = plVar2;
      }
      else if (((*start == 'm') && (str._7_1_ == '\x01')) ||
              ((*start == 'l' && (str._7_1_ == '\x02')))) {
        str._7_1_ = str._7_1_ + '\x01';
      }
      else {
        str._7_1_ = '\x04';
      }
    }
    start = start + local_7c;
    attr._4_4_ = lyxml_getutf8((ly_ctx *)data_local,start,&local_7c);
  }
  local_7c = (int)start - (int)delim;
  pcVar3 = lydict_insert((ly_ctx *)data_local,delim,(ulong)local_7c);
  a->name = pcVar3;
  pcVar3 = start;
LAB_0012fca3:
  while( true ) {
    start = pcVar3;
    bVar4 = true;
    if (((*start != ' ') && (bVar4 = true, *start != '\t')) && (bVar4 = true, *start != '\n')) {
      bVar4 = *start == '\r';
    }
    if (!bVar4) break;
    pcVar3 = start + 1;
  }
  if (*start == '=') {
    do {
      pcVar3 = start;
      start = pcVar3 + 1;
      bVar4 = true;
      if (((*start != ' ') && (bVar4 = true, *start != '\t')) && (bVar4 = true, *start != '\n')) {
        bVar4 = *start == '\r';
      }
    } while (bVar4);
    if ((*start == '\0') || ((*start != '\"' && (*start != '\'')))) {
      ly_vlog((ly_ctx *)data_local,LYE_XML_INVAL,LY_VLOG_NONE,(void *)0x0,
              "attribute value, \" or \' expected");
    }
    else {
      prefix = start;
      pcVar3 = pcVar3 + 2;
      delim_00 = *start;
      start = pcVar3;
      pcStack_60 = parse_text((ly_ctx *)data_local,pcVar3,delim_00,&local_7c);
      if ((pcStack_60 != (char *)0x0) || (local_7c != 0)) {
        pcVar3 = lydict_insert_zc((ly_ctx *)data_local,pcStack_60);
        a->value = pcVar3;
        *(uint *)parent_local = ((int)start + local_7c + 1) - (int)len_local;
        if (*(long *)(c + 0x10) == 0) {
          *(lyxml_attr **)(c + 0x10) = a;
        }
        else {
          for (lStack_78 = *(long *)(c + 0x10); *(long *)(lStack_78 + 8) != 0;
              lStack_78 = *(long *)(lStack_78 + 8)) {
          }
          *(lyxml_attr **)(lStack_78 + 8) = a;
        }
        free(pcStack_50);
        return a;
      }
      pcStack_60 = (char *)0x0;
    }
  }
  else {
    ly_vlog((ly_ctx *)data_local,LYE_XML_INVAL,LY_VLOG_NONE,(void *)0x0,
            "attribute definition, \"=\" expected");
  }
LAB_0012fea6:
  lyxml_free_attr((ly_ctx *)data_local,(lyxml_elem *)0x0,a);
  free(pcStack_50);
  return (lyxml_attr *)0x0;
}

Assistant:

static struct lyxml_attr *
parse_attr(struct ly_ctx *ctx, const char *data, unsigned int *len, struct lyxml_elem *parent)
{
    const char *c = data, *start, *delim;
    char *prefix = NULL, xml_flag, *str;
    int uc;
    struct lyxml_attr *attr = NULL, *a;
    unsigned int size;

    /* check if it is attribute or namespace */
    if (!strncmp(c, "xmlns", 5)) {
        /* namespace */
        attr = calloc(1, sizeof (struct lyxml_ns));
        LY_CHECK_ERR_RETURN(!attr, LOGMEM(ctx), NULL);

        attr->type = LYXML_ATTR_NS;
        ((struct lyxml_ns *)attr)->parent = parent;
        c += 5;
        if (*c != ':') {
            /* default namespace, prefix will be empty */
            goto equal;
        }
        c++;                    /* go after ':' to the prefix value */
    } else {
        /* attribute */
        attr = calloc(1, sizeof *attr);
        LY_CHECK_ERR_RETURN(!attr, LOGMEM(ctx), NULL);

        attr->type = LYXML_ATTR_STD;
    }

    /* process name part of the attribute */
    start = c;
    uc = lyxml_getutf8(ctx, c, &size);
    if (!is_xmlnamestartchar(uc)) {
        LOGVAL(ctx, LYE_XML_INVAL, LY_VLOG_NONE, NULL, "NameStartChar of the attribute");
        free(attr);
        return NULL;
    }
    xml_flag = 4;
    if (*c == 'x') {
        xml_flag = 1;
    }
    c += size;
    uc = lyxml_getutf8(ctx, c, &size);
    while (is_xmlnamechar(uc)) {
        if (attr->type == LYXML_ATTR_STD) {
            if ((*c == ':') && (xml_flag != 3)) {
                /* attribute in a namespace (but disregard the special "xml" namespace) */
                start = c + 1;

                /* look for the prefix in namespaces */
                prefix = malloc((c - data + 1) * sizeof *prefix);
                LY_CHECK_ERR_GOTO(!prefix, LOGMEM(ctx), error);
                memcpy(prefix, data, c - data);
                prefix[c - data] = '\0';
                attr->ns = lyxml_get_ns(parent, prefix);
            } else if (((*c == 'm') && (xml_flag == 1)) ||
                    ((*c == 'l') && (xml_flag == 2))) {
                ++xml_flag;
            } else {
                xml_flag = 4;
            }
        }
        c += size;
        uc = lyxml_getutf8(ctx, c, &size);
    }

    /* store the name */
    size = c - start;
    attr->name = lydict_insert(ctx, start, size);

equal:
    /* check Eq mark that can be surrounded by whitespaces */
    ign_xmlws(c);
    if (*c != '=') {
        LOGVAL(ctx, LYE_XML_INVAL, LY_VLOG_NONE, NULL, "attribute definition, \"=\" expected");
        goto error;
    }
    c++;
    ign_xmlws(c);

    /* process value part of the attribute */
    if (!*c || (*c != '"' && *c != '\'')) {
        LOGVAL(ctx, LYE_XML_INVAL, LY_VLOG_NONE, NULL, "attribute value, \" or \' expected");
        goto error;
    }
    delim = c;
    str = parse_text(ctx, ++c, *delim, &size);
    if (!str && !size) {
        goto error;
    }
    attr->value = lydict_insert_zc(ctx, str);

    *len = c + size + 1 - data; /* +1 is delimiter size */

    /* put attribute into the parent's attributes list */
    if (parent->attr) {
        /* go to the end of the list */
        for (a = parent->attr; a->next; a = a->next);
        /* and append new attribute */
        a->next = attr;
    } else {
        /* add the first attribute in the list */
        parent->attr = attr;
    }

    free(prefix);
    return attr;

error:
    lyxml_free_attr(ctx, NULL, attr);
    free(prefix);
    return NULL;
}